

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O2

EStatusCode __thiscall
CFFPrimitiveReader::ReadOffset(CFFPrimitiveReader *this,unsigned_long *outValue)

{
  EStatusCode EVar1;
  ulong in_RAX;
  Byte byteBuffer;
  ulong uStack_18;
  unsigned_short shortBuffer;
  
  EVar1 = eFailure;
  uStack_18 = in_RAX;
  switch(this->mCurrentOffsize) {
  case '\x01':
    EVar1 = ReadByte(this,&byteBuffer);
    if (EVar1 != eSuccess) {
      return eFailure;
    }
    uStack_18 = uStack_18 >> 0x28 & 0xff;
    break;
  case '\x02':
    EVar1 = ReadCard16(this,&shortBuffer);
    if (EVar1 != eSuccess) {
      return eFailure;
    }
    uStack_18 = uStack_18 >> 0x30;
    break;
  case '\x03':
    EVar1 = Read3ByteUnsigned(this,outValue);
    return EVar1;
  case '\x04':
    EVar1 = Read4ByteUnsigned(this,outValue);
    return EVar1;
  default:
    goto switchD_00175e24_default;
  }
  *outValue = uStack_18;
  EVar1 = eSuccess;
switchD_00175e24_default:
  return EVar1;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadOffset(unsigned long& outValue)
{
	EStatusCode status = PDFHummus::eFailure;

	switch(mCurrentOffsize)
	{
		case 1:
			Byte byteBuffer;
			status = ReadCard8(byteBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = byteBuffer;
			break;
		case 2:
			unsigned short shortBuffer;
			status = ReadCard16(shortBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = shortBuffer;
			break;
		case 3:
			status = Read3ByteUnsigned(outValue);
			break;
		case 4:
			status = Read4ByteUnsigned(outValue);
			break;

	}

	return status;
}